

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  istream *piVar1;
  ostream *poVar2;
  ulong uVar3;
  long STEPS;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long in_R9;
  long lVar7;
  long lVar8;
  long ystart;
  Sol best_sol;
  long yend;
  vector<ride,_std::allocator<ride>_> rides;
  long e_time;
  long s_time;
  long steps;
  long bonus;
  long nrides;
  long vehs;
  long cols;
  long rows;
  long xstart;
  long in_stack_fffffffffffffcf8;
  Sol local_2f8;
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  local_2d8;
  Sol local_2b8;
  vector<ride,_std::allocator<ride>_> local_2a0;
  undefined8 local_288;
  pointer local_280;
  undefined8 local_278;
  undefined8 local_270;
  long local_268;
  long local_260;
  size_type local_258;
  long local_250;
  pointer local_238;
  pointer pvStack_230;
  pointer local_228;
  ios_base local_140 [272];
  
  piVar1 = std::istream::_M_extract<long>(&std::cin);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  piVar1 = std::istream::_M_extract<long>((long *)piVar1);
  std::istream::_M_extract<long>((long *)piVar1);
  std::vector<ride,_std::allocator<ride>_>::vector
            (&local_2a0,local_258,(allocator_type *)&local_238);
  if (0 < (long)local_258) {
    lVar7 = 0x38;
    lVar8 = 0;
    do {
      piVar1 = std::istream::_M_extract<long>(&std::cin);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      piVar1 = std::istream::_M_extract<long>((long *)piVar1);
      std::istream::_M_extract<long>((long *)piVar1);
      lVar5 = (long)local_238 -
              (long)local_2d8.
                    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = -lVar5;
      if (0 < lVar5) {
        lVar6 = lVar5;
      }
      lVar5 = (long)local_2f8.
                    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)local_2b8.
                    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      in_R9 = -lVar5;
      if (0 < lVar5) {
        in_R9 = lVar5;
      }
      in_R9 = in_R9 + lVar6;
      *(long *)((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7 + -0x38) = lVar8;
      *(undefined8 *)
       ((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7 + -0x30) = local_270;
      *(undefined8 *)
       ((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7 + -0x28) = local_278;
      *(long *)((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar7 + -0x20) = in_R9;
      *(pointer *)
       ((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7 + -0x18) = local_238;
      *(pointer *)
       ((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7 + -0x10) =
           local_2f8.
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
              super__Vector_impl_data._M_start + lVar7 + -8) =
           local_2d8.
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)
       ((long)&(local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                super__Vector_impl_data._M_start)->id + lVar7) =
           local_2b8.
           super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x40;
    } while (lVar8 < (long)local_258);
  }
  local_2f8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0;
  local_2f8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8.
  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_280 = _VTT;
  local_288 = ___cxa_atexit;
  uVar4 = 0;
  do {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"iteration: ",0xb);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", threshold: ",0xd);
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    earliestStart(&local_2b8,&local_2a0,local_250,local_268,lVar7,in_R9,in_stack_fffffffffffffcf8);
    local_228 = local_2f8.
                super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pvStack_230 = local_2f8.
                  super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_238 = local_2f8.
                super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    local_2f8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2b8.
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2f8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2b8.
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2f8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2b8.
         super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector((vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
               *)&local_238);
    std::
    vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
    ::~vector(&local_2b8);
    uVar3 = simulate(&local_2f8,local_260,STEPS);
    if (uVar4 < uVar3) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Improved: ",10);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"->",2);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::
      vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
      ::operator=(&local_2d8,&local_2f8);
      std::ofstream::ofstream((ostream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Writing to file",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      std::ofstream::open((char *)&local_238,0x1051bd);
      print_assignments(&local_2d8,(ostream *)&local_238);
      std::ofstream::close();
      local_238 = local_280;
      *(undefined8 *)
       ((long)&local_238 +
       (long)local_280[-1].super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
             super__Vector_impl_data._M_start) = local_288;
      std::filebuf::~filebuf((filebuf *)&pvStack_230);
      std::ios_base::~ios_base(local_140);
      uVar4 = uVar3;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1e);
  print_assignments(&local_2d8,(ostream *)&std::cout);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector(&local_2d8);
  std::
  vector<std::vector<ride,_std::allocator<ride>_>,_std::allocator<std::vector<ride,_std::allocator<ride>_>_>_>
  ::~vector(&local_2f8);
  if (local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a0.super__Vector_base<ride,_std::allocator<ride>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    long rows, cols, vehs, nrides, bonus, steps;
    cin >> rows >> cols >> vehs >> nrides >> bonus >> steps;

    vector<ride> rides(nrides);
    for (long i = 0; i < nrides; i++) {
        long xstart, ystart, xend, yend, s_time, e_time;
        cin >> xstart >> ystart >> xend >> yend >> s_time >> e_time;
        pt start{xstart, ystart};
        pt end{xend, yend};
        long len = dist(start, end);
        rides[i] = ride {i, s_time, e_time, len, start, end};
    }



    Sol sol;
//    if (nrides == 3 && vehs == 2 && rows == 3 && cols == 4) {
//        sol = exampleA(rides, vehs);
//    } else if (rows == 800 && cols == 1000 && bonus == 25 && steps == 25000) {
        // TODO: ex B
//    }

    Sol best_sol;
    ulong best_pts = 0;
    for (long i = 0; i < 30; i++) {
//        long THRESHOLD = 9 + (rand() % static_cast<int>(16 - 9 + 1));
        long THRESHOLD = i;
        cerr << "iteration: " << i << ", threshold: " << THRESHOLD << endl;
        sol = earliestStart(rides, vehs, steps, THRESHOLD, rows, cols);
        ulong pts = simulate(sol, bonus, steps); // print points
        if (pts > best_pts) {
            cerr << "Improved: " << best_pts << "->" << pts << endl;
            best_pts = pts;
            best_sol = sol;

            ofstream f;
            cerr << "Writing to file" << endl;
            f.open("/tmp/res.txt");
            print_assignments(best_sol, f);
            f.close();
        }
    }

    print_assignments(best_sol, cout);

    return 0;
}